

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_alert::torrent_alert
          (torrent_alert *this,stack_allocator *alloc,torrent_handle *h)

{
  bool bVar1;
  allocation_slot aVar2;
  element_type *peVar3;
  ulong uVar4;
  info_hash_t *piVar5;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  aux *local_108;
  char *local_100;
  string local_f8;
  string_view local_d8;
  int local_c4;
  aux *local_c0;
  char *local_b8;
  string local_b0;
  string_view local_90;
  int local_7c;
  string_view local_78;
  int local_64;
  undefined1 local_60 [8];
  string name_str;
  undefined1 local_30 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  torrent_alert *this_local;
  
  t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)h;
  libtorrent::alert::alert(&this->super_alert);
  (this->super_alert)._vptr_alert = (_func_int **)&PTR__torrent_alert_00b88870;
  torrent_handle::torrent_handle
            (&this->handle,
             (torrent_handle *)
             t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  ::std::reference_wrapper<libtorrent::aux::stack_allocator_const>::
  reference_wrapper<libtorrent::aux::stack_allocator&,void,libtorrent::aux::stack_allocator_const*>
            ((reference_wrapper<libtorrent::aux::stack_allocator_const> *)&this->m_alloc,alloc);
  libtorrent::aux::allocation_slot::allocation_slot(&this->m_name_idx);
  torrent_handle::native_handle((torrent_handle *)local_30);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    libtorrent::aux::torrent::name_abi_cxx11_((string *)local_60,peVar3);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      local_78 = (string_view)
                 ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
      local_64 = (int)libtorrent::aux::stack_allocator::copy_string(alloc,local_78);
      (this->m_name_idx).m_idx = local_64;
    }
    else {
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      piVar5 = libtorrent::aux::torrent::info_hash(peVar3);
      bVar1 = info_hash_t::has_v2(piVar5);
      if (bVar1) {
        peVar3 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        piVar5 = libtorrent::aux::torrent::info_hash(peVar3);
        span<char_const>::span<libtorrent::digest32<256l>,char,void>
                  ((span<char_const> *)&local_c0,&piVar5->v2);
        in.m_len = in_RCX;
        in.m_ptr = local_b8;
        libtorrent::aux::to_hex_abi_cxx11_(&local_b0,local_c0,in);
        local_90 = (string_view)
                   ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
        local_7c = (int)libtorrent::aux::stack_allocator::copy_string(alloc,local_90);
        (this->m_name_idx).m_idx = local_7c;
        ::std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        peVar3 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        piVar5 = libtorrent::aux::torrent::info_hash(peVar3);
        span<char_const>::span<libtorrent::digest32<160l>,char,void>
                  ((span<char_const> *)&local_108,&piVar5->v1);
        in_00.m_len = in_RCX;
        in_00.m_ptr = local_100;
        libtorrent::aux::to_hex_abi_cxx11_(&local_f8,local_108,in_00);
        local_d8 = (string_view)
                   ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f8);
        local_c4 = (int)libtorrent::aux::stack_allocator::copy_string(alloc,local_d8);
        (this->m_name_idx).m_idx = local_c4;
        ::std::__cxx11::string::~string((string *)&local_f8);
      }
    }
    ::std::__cxx11::string::~string((string *)local_60);
  }
  else {
    aVar2 = libtorrent::aux::stack_allocator::copy_string(alloc,"");
    (this->m_name_idx).m_idx = aVar2.m_idx;
  }
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_30);
  return;
}

Assistant:

torrent_alert::torrent_alert(aux::stack_allocator& alloc
		, torrent_handle const& h)
		: handle(h)
		, m_alloc(alloc)
	{
		auto t = h.native_handle();
		if (t)
		{
			std::string name_str = t->name();
			if (!name_str.empty())
			{
				m_name_idx = alloc.copy_string(name_str);
			}
			else
			{
				if (t->info_hash().has_v2())
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v2));
				else
					m_name_idx = alloc.copy_string(aux::to_hex(t->info_hash().v1));
			}
		}
		else
		{
			m_name_idx = alloc.copy_string("");
		}

#if TORRENT_ABI_VERSION == 1
		name = m_alloc.get().ptr(m_name_idx);
#endif
	}